

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.cpp
# Opt level: O1

void test_divceil<std::vector<unsigned_short,std::allocator<unsigned_short>>,signed_char>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *values,char divisor,
               size_t attempt_count)

{
  ushort *puVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  size_t sVar5;
  ushort *puVar6;
  undefined1 auVar7 [16];
  
  auVar7 = std::chrono::_V2::steady_clock::now();
  uVar4 = auVar7._8_8_;
  if (attempt_count != 0) {
    sVar5 = 0;
    do {
      puVar1 = (values->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (puVar6 = (values->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                    _M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
      {
        burst::divceil<unsigned_short,signed_char>
                  ((burst *)(ulong)*puVar6,(short)divisor,(Integer<signed_char>)uVar4);
        uVar4 = extraout_RDX;
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != attempt_count);
  }
  lVar2 = std::chrono::_V2::steady_clock::now();
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_1efe0,0xc)
  ;
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - auVar7._0_8_) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void test_divceil (const Container & values, Integer divisor, std::size_t attempt_count)
{
    using namespace std::chrono;
    using value_type = typename Container::value_type;

    const auto start_time = steady_clock::now();

    auto total = value_type{0};
    for (std::size_t iteration = 0; iteration < attempt_count; ++iteration)
    {
        auto r =
            std::accumulate(values.begin(), values.end(), value_type{0},
                [divisor] (auto a, auto b)
                {
                    return a + burst::divceil(b, divisor);
                });
        // Убогий ГЦЦ не может осилить оператор `+=`.
        total = static_cast<value_type>(total + r);
    }

    const auto total_time = steady_clock::now() - start_time;

    std::clog << total << std::endl;
    const auto time = duration_cast<duration<double>>(total_time).count();
    std::cout << "Время: " << time << std::endl;
}